

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cTextureFilterMinmaxTests.cpp
# Opt level: O0

void __thiscall
gl4cts::TextureFilterMinmaxUtils::~TextureFilterMinmaxUtils(TextureFilterMinmaxUtils *this)

{
  bool bVar1;
  reference ppSVar2;
  SupportedTextureType *textureType;
  __normal_iterator<gl4cts::TextureFilterMinmaxUtils::SupportedTextureType_**,_std::vector<gl4cts::TextureFilterMinmaxUtils::SupportedTextureType_*,_std::allocator<gl4cts::TextureFilterMinmaxUtils::SupportedTextureType_*>_>_>
  local_20;
  __normal_iterator<gl4cts::TextureFilterMinmaxUtils::SupportedTextureType_*const_*,_std::vector<gl4cts::TextureFilterMinmaxUtils::SupportedTextureType_*,_std::allocator<gl4cts::TextureFilterMinmaxUtils::SupportedTextureType_*>_>_>
  local_18;
  SupportedTextureTypeIter iter;
  TextureFilterMinmaxUtils *this_local;
  
  iter._M_current = (SupportedTextureType **)this;
  local_20._M_current =
       (SupportedTextureType **)
       std::
       vector<gl4cts::TextureFilterMinmaxUtils::SupportedTextureType_*,_std::allocator<gl4cts::TextureFilterMinmaxUtils::SupportedTextureType_*>_>
       ::begin(&this->m_supportedTextureTypes);
  __gnu_cxx::
  __normal_iterator<gl4cts::TextureFilterMinmaxUtils::SupportedTextureType*const*,std::vector<gl4cts::TextureFilterMinmaxUtils::SupportedTextureType*,std::allocator<gl4cts::TextureFilterMinmaxUtils::SupportedTextureType*>>>
  ::__normal_iterator<gl4cts::TextureFilterMinmaxUtils::SupportedTextureType**>
            ((__normal_iterator<gl4cts::TextureFilterMinmaxUtils::SupportedTextureType*const*,std::vector<gl4cts::TextureFilterMinmaxUtils::SupportedTextureType*,std::allocator<gl4cts::TextureFilterMinmaxUtils::SupportedTextureType*>>>
              *)&local_18,&local_20);
  while( true ) {
    textureType = (SupportedTextureType *)
                  std::
                  vector<gl4cts::TextureFilterMinmaxUtils::SupportedTextureType_*,_std::allocator<gl4cts::TextureFilterMinmaxUtils::SupportedTextureType_*>_>
                  ::end(&this->m_supportedTextureTypes);
    bVar1 = __gnu_cxx::operator!=
                      (&local_18,
                       (__normal_iterator<gl4cts::TextureFilterMinmaxUtils::SupportedTextureType_**,_std::vector<gl4cts::TextureFilterMinmaxUtils::SupportedTextureType_*,_std::allocator<gl4cts::TextureFilterMinmaxUtils::SupportedTextureType_*>_>_>
                        *)&textureType);
    if (!bVar1) break;
    ppSVar2 = __gnu_cxx::
              __normal_iterator<gl4cts::TextureFilterMinmaxUtils::SupportedTextureType_*const_*,_std::vector<gl4cts::TextureFilterMinmaxUtils::SupportedTextureType_*,_std::allocator<gl4cts::TextureFilterMinmaxUtils::SupportedTextureType_*>_>_>
              ::operator*(&local_18);
    if (*ppSVar2 != (SupportedTextureType *)0x0) {
      (*(*ppSVar2)->_vptr_SupportedTextureType[3])();
    }
    __gnu_cxx::
    __normal_iterator<gl4cts::TextureFilterMinmaxUtils::SupportedTextureType_*const_*,_std::vector<gl4cts::TextureFilterMinmaxUtils::SupportedTextureType_*,_std::allocator<gl4cts::TextureFilterMinmaxUtils::SupportedTextureType_*>_>_>
    ::operator++(&local_18);
  }
  std::
  vector<gl4cts::TextureFilterMinmaxUtils::SupportedTextureType_*,_std::allocator<gl4cts::TextureFilterMinmaxUtils::SupportedTextureType_*>_>
  ::~vector(&this->m_supportedTextureTypes);
  std::
  vector<gl4cts::TextureFilterMinmaxUtils::SupportedTextureDataType,_std::allocator<gl4cts::TextureFilterMinmaxUtils::SupportedTextureDataType>_>
  ::~vector(&this->m_supportedTextureDataTypes);
  std::
  vector<gl4cts::TextureFilterMinmaxUtils::ReductionModeParam,_std::allocator<gl4cts::TextureFilterMinmaxUtils::ReductionModeParam>_>
  ::~vector(&this->m_reductionModeParams);
  return;
}

Assistant:

TextureFilterMinmaxUtils::~TextureFilterMinmaxUtils()
{
	for (SupportedTextureTypeIter iter = m_supportedTextureTypes.begin(); iter != m_supportedTextureTypes.end(); ++iter)
	{
		SupportedTextureType* textureType = *iter;
		delete textureType;
	}
}